

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::_Test_UnexpectedMiddleType::_Run(_Test_UnexpectedMiddleType *this)

{
  uint32_t uVar1;
  uint8_t *buffer;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [24];
  stringstream local_1a8 [392];
  
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"foo","");
  LogTest::Write(&this->super_LogTest,(string *)local_1c0);
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_);
  }
  (this->super_LogTest).dest_.contents_._M_dataplus._M_p[6] = '\x03';
  uVar1 = crc32c::Extend(0,(this->super_LogTest).dest_.contents_._M_dataplus._M_p + 6,4);
  *(uint32_t *)(this->super_LogTest).dest_.contents_._M_dataplus._M_p =
       (uVar1 << 0x11 | uVar1 >> 0xf) + 0xa282ead8;
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1a8;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_200,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [4])"EOF",&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1a9;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1e0._M_dataplus._M_p._0_4_ = 3;
  local_200._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>
            ((Tester *)local_1c0,(int *)&local_1e0,(unsigned_long *)&local_200);
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1aa;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"missing start","");
  LogTest::MatchError(&local_200,&this->super_LogTest,&local_1e0);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [3])"OK",&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  return;
}

Assistant:

TEST(LogTest, UnexpectedMiddleType) {
  Write("foo");
  SetByte(6, kMiddleType);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("missing start"));
}